

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result_conflict *
validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetwork>
          (Result_conflict *__return_storage_ptr__,NeuralNetwork *nn)

{
  bool bVar1;
  undefined1 local_a8 [40];
  Result local_80;
  Result local_48;
  NeuralNetwork *local_18;
  NeuralNetwork *nn_local;
  Result_conflict *r;
  
  local_48.m_message._M_storage._M_storage[7] = '\0';
  local_18 = nn;
  nn_local = (NeuralNetwork *)__return_storage_ptr__;
  CoreML::Result::Result((Result *)__return_storage_ptr__);
  validateUpdatableLayerSupport<CoreML::Specification::NeuralNetwork>
            ((Result_conflict *)&local_48,local_18);
  CoreML::Result::operator=((Result *)__return_storage_ptr__,&local_48);
  CoreML::Result::~Result(&local_48);
  bVar1 = CoreML::Result::good((Result *)__return_storage_ptr__);
  if (bVar1) {
    validateLayerAndLossLayerNamesCollisions<CoreML::Specification::NeuralNetwork>
              ((Result_conflict *)(local_a8 + 0x28),local_18);
    CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_a8 + 0x28));
    CoreML::Result::~Result((Result *)(local_a8 + 0x28));
    bVar1 = CoreML::Result::good((Result *)__return_storage_ptr__);
    if (bVar1) {
      isTrainingConfigurationSupported<CoreML::Specification::NeuralNetwork>
                ((Result_conflict *)local_a8,local_18);
      CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)local_a8);
      CoreML::Result::~Result((Result *)local_a8);
      CoreML::Result::good((Result *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateUpdatableNeuralNetwork(const T& nn) {
    
    Result r;

    r = validateUpdatableLayerSupport(nn);
    if (!r.good()) {return r;}
    
    r = validateLayerAndLossLayerNamesCollisions(nn);
    if (!r.good()) {return r;}

    r = isTrainingConfigurationSupported(nn);
    if (!r.good()) {return r;}
    
    return r;
}